

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolortransform.cpp
# Opt level: O3

void storeUnpremultipliedLUT<QRgba64>
               (QCmyk32 *dst,QRgba64 *param_2,QColorVector *buffer,qsizetype len)

{
  long lVar1;
  float *pfVar2;
  
  if (0 < len) {
    pfVar2 = &buffer->w;
    lVar1 = 0;
    do {
      dst[lVar1].m_cmyk =
           (int)(*pfVar2 * 255.0) << 0x18 | (int)(pfVar2[-1] * 255.0) << 0x10 |
           (int)(pfVar2[-2] * 255.0) << 8 | (int)(((QColorVector *)(pfVar2 + -3))->x * 255.0);
      lVar1 = lVar1 + 1;
      pfVar2 = pfVar2 + 4;
    } while (len != lVar1);
  }
  return;
}

Assistant:

void storeUnpremultipliedLUT(QCmyk32 *dst, const T *, const QColorVector *buffer, const qsizetype len)
{
    for (qsizetype i = 0; i < len; ++i) {
        const int c = buffer[i].x * 255.f;
        const int m = buffer[i].y * 255.f;
        const int y = buffer[i].z * 255.f;
        const int k = buffer[i].w * 255.f;
        dst[i] = QCmyk32(c, m, y, k);
    }
}